

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O0

void __thiscall
VectorSUnitTest_insert_initializer_list_Test::VectorSUnitTest_insert_initializer_list_Test
          (VectorSUnitTest_insert_initializer_list_Test *this)

{
  VectorSUnitTest_insert_initializer_list_Test *this_local;
  
  VectorSUnitTest::VectorSUnitTest(&this->super_VectorSUnitTest);
  (this->super_VectorSUnitTest).super_Test._vptr_Test =
       (_func_int **)&PTR__VectorSUnitTest_insert_initializer_list_Test_001d1098;
  return;
}

Assistant:

TEST_F(VectorSUnitTest, insert_initializer_list)
{
    vector_s<unsigned, 12> v{0u,1u,2u};
    EXPECT_EQ(0u, v[0]);
    EXPECT_EQ(1u, v[1]);
    EXPECT_EQ(2u, v[2]);
    EXPECT_EQ(3u, v.size());


    // Insert 3 elements from start
    v.insert(v.begin(), {10u,20u,30u});
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(20u, v[1]);
    EXPECT_EQ(30u, v[2]);
    EXPECT_EQ(0u, v[3]);
    EXPECT_EQ(1u, v[4]);
    EXPECT_EQ(2u, v[5]);
    EXPECT_EQ(6u, v.size());

    // Insert 3 elements in the middle
    v.insert(v.begin()+3, {10u,20u,30u});
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(20u, v[1]);
    EXPECT_EQ(30u, v[2]);
    EXPECT_EQ(10u, v[3]);
    EXPECT_EQ(20u, v[4]);
    EXPECT_EQ(30u, v[5]);
    EXPECT_EQ(0u, v[6]);
    EXPECT_EQ(1u, v[7]);
    EXPECT_EQ(2u, v[8]);
    EXPECT_EQ(9u, v.size());

    // Insert 3 elements 'in' the end
    v.insert(v.end(), {10u,20u,30u});
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(20u, v[1]);
    EXPECT_EQ(30u, v[2]);
    EXPECT_EQ(10u, v[3]);
    EXPECT_EQ(20u, v[4]);
    EXPECT_EQ(30u, v[5]);
    EXPECT_EQ(0u, v[6]);
    EXPECT_EQ(1u, v[7]);
    EXPECT_EQ(2u, v[8]);
    EXPECT_EQ(10u, v[9]);
    EXPECT_EQ(20u, v[10]);
    EXPECT_EQ(30u, v[11]);
    EXPECT_EQ(12u, v.size());
}